

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  uint local_3f0;
  uint i;
  undefined1 local_3e0 [8];
  MyPlugin1 p1;
  MyPlugin p0;
  char **argv_local;
  int argc_local;
  
  p0.sig2.m_funcs.super_type.m_rest_of_storage[0xe]._8_8_ = argv;
  MyPlugin::MyPlugin((MyPlugin *)&p1.m_fc2.m_connected);
  MyPlugin1::MyPlugin1((MyPlugin1 *)local_3e0);
  MyPlugin1::init((MyPlugin1 *)local_3e0,(EVP_PKEY_CTX *)&p1.m_fc2.m_connected);
  if (argc == 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Testing fast signals");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_3f0 = 0; local_3f0 < 100000000; local_3f0 = local_3f0 + 1) {
      sigc::signal<void>::emit((signal<void> *)&p1.m_fc2.m_connected);
      sigc::signal<void,_int>::emit
                ((signal<void,_int> *)((long)p0.sig0.m_funcs.super_type.m_rest_of_storage + 0xe8),
                 local_3f0);
      sigc::signal<void,_int,_void_*>::emit
                ((signal<void,_int,_void_*> *)
                 ((long)p0.sig1.m_funcs.super_type.m_rest_of_storage + 0xe8),local_3f0,
                 (void *)(ulong)(local_3f0 + 1));
    }
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(ulong)local_3e0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  MyPlugin1::~MyPlugin1((MyPlugin1 *)local_3e0);
  MyPlugin::~MyPlugin((MyPlugin *)&p1.m_fc2.m_connected);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    MyPlugin p0;
    MyPlugin1 p1;
    p1.init(&p0);

    if (argc == 1) {
        std::cout << "Testing fast signals" << std::endl;
        for (unsigned i = 0; i < 100000000; ++i) {
            p0.sig0.emit();
            p0.sig1.emit(i);
            p0.sig2.emit(i, (char *) (uintptr_t)(i + 1));
        }
    }

    std::cout << p1.m_counter << std::endl;
}